

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_25095d::NestedName::printLeft(NestedName *this,OutputStream *S)

{
  StringView R;
  
  Node::print(this->Qual,S);
  R.Last = "";
  R.First = "::";
  OutputStream::operator+=(S,R);
  Node::print(this->Name,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    Qual->print(S);
    S += "::";
    Name->print(S);
  }